

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

void __thiscall wabt::TypeChecker::PushType(TypeChecker *this,Type type)

{
  pointer *ppTVar1;
  iterator __position;
  Type local_8;
  
  if (type.enum_ != Void) {
    __position._M_current =
         (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_8 = type;
      std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_realloc_insert<wabt::Type_const&>
                ((vector<wabt::Type,std::allocator<wabt::Type>> *)&this->type_stack_,__position,
                 &local_8);
    }
    else {
      *__position._M_current = type;
      ppTVar1 = &(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppTVar1 = *ppTVar1 + 1;
    }
  }
  return;
}

Assistant:

void TypeChecker::PushType(Type type) {
  if (type != Type::Void) {
    type_stack_.push_back(type);
  }
}